

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

void __thiscall cfd::core::ExtPrivkey::ExtPrivkey(ExtPrivkey *this,string *base58_data)

{
  ByteData256 local_30;
  string *local_18;
  string *base58_data_local;
  ExtPrivkey *this_local;
  
  local_18 = base58_data;
  base58_data_local = (string *)this;
  ByteData256::ByteData256(&local_30);
  ExtPrivkey(this,base58_data,&local_30);
  ByteData256::~ByteData256((ByteData256 *)0x4440c9);
  return;
}

Assistant:

ExtPrivkey::ExtPrivkey(const std::string& base58_data)
    : ExtPrivkey(base58_data, ByteData256()) {
  // do nothing
}